

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O3

void __thiscall EmmyFacade::Hook(EmmyFacade *this,lua_State *L,lua_Debug *ar)

{
  EmmyDebuggerManager *this_00;
  Transporter *this_01;
  undefined8 this_02;
  json_value jVar1;
  bool bVar2;
  reference this_03;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  obj;
  undefined1 local_68 [16];
  Debugger *local_58;
  json_value jStack_50;
  value_t local_38;
  json_value local_30;
  
  this_00 = &this->_emmyDebuggerManager;
  EmmyDebuggerManager::GetDebugger((EmmyDebuggerManager *)local_68,(lua_State *)this_00);
  if ((Debugger *)local_68._0_8_ == (Debugger *)0x0) {
    if (this->workMode == Attach) {
      EmmyDebuggerManager::AddDebugger
                ((EmmyDebuggerManager *)&stack0xffffffffffffffa8,(lua_State *)this_00);
      jVar1 = jStack_50;
      local_68._0_8_ = local_58;
      this_02 = local_68._8_8_;
      local_58 = (Debugger *)0x0;
      jStack_50.object = (object_t *)0x0;
      local_68._8_8_ = jVar1;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_50.object !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_50.object);
        }
      }
      install_emmy_debugger(L);
      bVar2 = EmmyDebuggerManager::IsRunning(this_00);
      if (bVar2) {
        Debugger::Start((Debugger *)local_68._0_8_);
        Debugger::Attach((Debugger *)local_68._0_8_);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&stack0xffffffffffffffa8,(initializer_list_t)ZEXT816(0),false,object);
      local_38 = null;
      local_30.object = (object_t *)0x0;
      nlohmann::detail::external_constructor<(nlohmann::detail::value_t)5>::
      construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&stack0xffffffffffffffc8,(number_integer_t)L);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&stack0xffffffffffffffc8,true);
      this_03 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)&stack0xffffffffffffffa8,"state");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator=(this_03,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&stack0xffffffffffffffc8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&stack0xffffffffffffffc8);
      this_01 = (this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&stack0xffffffffffffffb8,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&stack0xffffffffffffffa8);
      Transporter::Send(this_01,0xe,(json *)&stack0xffffffffffffffb8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&stack0xffffffffffffffb8);
      Debugger::Hook((Debugger *)local_68._0_8_,ar,L);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&stack0xffffffffffffffa8);
    }
  }
  else {
    bVar2 = Debugger::IsRunning((Debugger *)local_68._0_8_);
    if (bVar2) {
      Debugger::Hook((Debugger *)local_68._0_8_,ar,L);
    }
    else if (this->workMode == EmmyCore) {
      if (luaVersion != LUA_JIT) {
        bVar2 = Debugger::IsMainCoroutine((Debugger *)local_68._0_8_,L);
        if (!bVar2) goto LAB_0013693b;
      }
      (*lua_sethook)(L,ReadyLuaHook,7,0);
    }
  }
LAB_0013693b:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  return;
}

Assistant:

void EmmyFacade::Hook(lua_State *L, lua_Debug *ar) {
	auto debugger = GetDebugger(L);
	if (debugger) {
		if (!debugger->IsRunning()) {
			if (GetWorkMode() == WorkMode::EmmyCore) {
				if (luaVersion != LuaVersion::LUA_JIT) {
					if (debugger->IsMainCoroutine(L)) {
						SetReadyHook(L);
					}
				} else {
					SetReadyHook(L);
				}
			}
			return;
		}

		debugger->Hook(ar, L);
	} else {
		if (workMode == WorkMode::Attach) {
			debugger = _emmyDebuggerManager.AddDebugger(L);
			install_emmy_debugger(L);
			if (_emmyDebuggerManager.IsRunning()) {
				debugger->Start();
				debugger->Attach();
			}
			// send attached notify
			auto obj = nlohmann::json::object();
			obj["state"] = reinterpret_cast<int64_t>(L);

			this->transporter->Send(int(MessageCMD::AttachedNotify), obj);

			debugger->Hook(ar, L);
		}
	}
}